

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

void __thiscall CallStatement::print(CallStatement *this)

{
  ostream *poVar1;
  Testlist *pTVar2;
  string local_30 [32];
  CallStatement *local_10;
  CallStatement *this_local;
  
  local_10 = this;
  (*(this->super_Function).super_Statement._vptr_Statement[3])();
  poVar1 = std::operator<<((ostream *)&std::cout,local_30);
  std::operator<<(poVar1,"(");
  std::__cxx11::string::~string(local_30);
  pTVar2 = testList(this);
  if (pTVar2 != (Testlist *)0x0) {
    pTVar2 = testList(this);
    Testlist::print(pTVar2);
  }
  std::operator<<((ostream *)&std::cout,")");
  return;
}

Assistant:

void CallStatement::print() {
//    id().print();
    std::cout << id() << "(";
    if(testList() != nullptr) testList()->print();
    std::cout << ")";
}